

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.cpp
# Opt level: O3

int __thiscall ncnn::RNN::forward(RNN *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint _h;
  size_t sVar1;
  int *piVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  void *__src;
  void *__dest;
  bool bVar7;
  Mat m_2;
  Mat m;
  Mat m_4;
  Mat m_1;
  Mat local_c8;
  Mat m_5;
  
  _h = bottom_blob->h;
  iVar5 = this->direction;
  local_c8.cstep = 0;
  local_c8.data = (void *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8._20_8_ = 0;
  local_c8.allocator = (Allocator *)0x0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  Mat::create(&local_c8,this->num_output,4,opt->workspace_allocator);
  iVar4 = -100;
  if (local_c8.data == (void *)0x0) goto LAB_002088b1;
  if (local_c8.cstep * (long)local_c8.c == 0) goto LAB_002088b1;
  uVar3 = (int)local_c8.cstep * local_c8.c;
  if (0 < (int)uVar3) {
    memset(local_c8.data,0,(ulong)uVar3 << 2);
  }
  Mat::create(top_blob,this->num_output << (iVar5 == 2),_h,4,opt->blob_allocator);
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_002088b1;
  uVar3 = this->direction;
  if (uVar3 < 2) {
    bVar7 = (this->weight_xc_data).dims == 3;
    m.w = (this->weight_xc_data).w;
    m.h = (this->weight_xc_data).h;
    m.c = 1;
    if (!bVar7) {
      m.c = (this->weight_xc_data).d;
    }
    m.dims = bVar7 ^ 3;
    m.data = (this->weight_xc_data).data;
    sVar1 = (this->weight_xc_data).elemsize;
    m.elempack = (this->weight_xc_data).elempack;
    m.allocator = (this->weight_xc_data).allocator;
    m.refcount._0_4_ = 0;
    m.refcount._4_4_ = 0;
    m.elemsize._0_4_ = (undefined4)sVar1;
    m.elemsize._4_4_ = (undefined4)(sVar1 >> 0x20);
    m.cstep = (long)m.h * (long)m.w;
    m.d = 1;
    bVar7 = (this->bias_c_data).dims == 3;
    m_1.w = (this->bias_c_data).w;
    m_1.h = (this->bias_c_data).h;
    m_1.c = 1;
    if (!bVar7) {
      m_1.c = (this->bias_c_data).d;
    }
    m_1.dims = bVar7 ^ 3;
    m_1.data = (this->bias_c_data).data;
    sVar1 = (this->bias_c_data).elemsize;
    m_1.elempack = (this->bias_c_data).elempack;
    m_1.allocator = (this->bias_c_data).allocator;
    m_1.refcount._0_4_ = 0;
    m_1.refcount._4_4_ = 0;
    m_1.elemsize._0_4_ = (undefined4)sVar1;
    m_1.elemsize._4_4_ = (undefined4)(sVar1 >> 0x20);
    m_1.cstep = (long)m_1.h * (long)m_1.w;
    m_1.d = 1;
    bVar7 = (this->weight_hc_data).dims == 3;
    m_2.w = (this->weight_hc_data).w;
    m_2.h = (this->weight_hc_data).h;
    m_2.c = 1;
    if (!bVar7) {
      m_2.c = (this->weight_hc_data).d;
    }
    m_2.dims = bVar7 ^ 3;
    m_2.data = (this->weight_hc_data).data;
    m_2.elemsize = (this->weight_hc_data).elemsize;
    m_2.elempack = (this->weight_hc_data).elempack;
    m_2.allocator = (this->weight_hc_data).allocator;
    m_2.refcount = (int *)0x0;
    m_2.cstep = (long)m_2.h * (long)m_2.w;
    m_2.d = 1;
    iVar4 = rnn(bottom_blob,top_blob,uVar3,&m,&m_1,&m_2,&local_c8,(Option *)opt->workspace_allocator
               );
    piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          if (m.data != (void *)0x0) {
            free(m.data);
          }
        }
        else {
          (**(code **)(*(long *)m.allocator + 0x18))();
        }
      }
    }
    if (iVar4 != 0) goto LAB_002088b1;
    uVar3 = this->direction;
  }
  if (uVar3 == 2) {
    m.cstep = 0;
    m.data = (void *)0x0;
    m.refcount._0_4_ = 0;
    m.refcount._4_4_ = 0;
    m.elemsize._0_4_ = 0;
    m.elemsize._4_4_ = 0;
    m.elempack = 0;
    m.allocator = (Allocator *)0x0;
    m.dims = 0;
    m.w = 0;
    m.h = 0;
    m.d = 0;
    m.c = 0;
    Mat::create(&m,this->num_output,_h,4,opt->workspace_allocator);
    iVar4 = -100;
    if ((m.data == (void *)0x0) || ((long)m.c * m.cstep == 0)) {
      bVar7 = false;
    }
    else {
      m_1.cstep = 0;
      m_1.data = (void *)0x0;
      m_1.refcount._0_4_ = 0;
      m_1.refcount._4_4_ = 0;
      m_1.elemsize._0_4_ = 0;
      m_1.elemsize._4_4_ = 0;
      m_1.elempack = 0;
      m_1.allocator = (Allocator *)0x0;
      m_1.dims = 0;
      m_1.w = 0;
      m_1.h = 0;
      m_1.d = 0;
      m_1.c = 0;
      Mat::create(&m_1,this->num_output,_h,4,opt->workspace_allocator);
      iVar4 = -100;
      if ((m_1.data == (void *)0x0) || ((long)m_1.c * m_1.cstep == 0)) {
LAB_00208914:
        bVar7 = false;
      }
      else {
        bVar7 = (this->weight_xc_data).dims == 3;
        m_2.w = (this->weight_xc_data).w;
        m_2.h = (this->weight_xc_data).h;
        m_2.c = 1;
        if (!bVar7) {
          m_2.c = (this->weight_xc_data).d;
        }
        m_2.dims = bVar7 ^ 3;
        m_2.data = (this->weight_xc_data).data;
        m_2.elemsize = (this->weight_xc_data).elemsize;
        m_2.elempack = (this->weight_xc_data).elempack;
        m_2.allocator = (this->weight_xc_data).allocator;
        m_2.refcount = (int *)0x0;
        m_2.cstep = (long)m_2.h * (long)m_2.w;
        m_2.d = 1;
        bVar7 = (this->bias_c_data).dims == 3;
        m_4.w = (this->bias_c_data).w;
        m_4.h = (this->bias_c_data).h;
        m_4.c = 1;
        if (!bVar7) {
          m_4.c = (this->bias_c_data).d;
        }
        m_4.dims = bVar7 ^ 3;
        m_4.data = (this->bias_c_data).data;
        m_4.elemsize = (this->bias_c_data).elemsize;
        m_4.elempack = (this->bias_c_data).elempack;
        m_4.allocator = (this->bias_c_data).allocator;
        m_4.refcount = (int *)0x0;
        m_4.cstep = (long)m_4.h * (long)m_4.w;
        m_4.d = 1;
        bVar7 = (this->weight_hc_data).dims == 3;
        m_5.w = (this->weight_hc_data).w;
        m_5.h = (this->weight_hc_data).h;
        m_5.c = 1;
        if (!bVar7) {
          m_5.c = (this->weight_hc_data).d;
        }
        m_5.dims = bVar7 ^ 3;
        m_5.data = (this->weight_hc_data).data;
        m_5.elemsize = (this->weight_hc_data).elemsize;
        m_5.elempack = (this->weight_hc_data).elempack;
        m_5.allocator = (this->weight_hc_data).allocator;
        m_5.refcount = (int *)0x0;
        m_5.cstep = (long)m_5.h * (long)m_5.w;
        m_5.d = 1;
        iVar4 = rnn(bottom_blob,&m,0,&m_2,&m_4,&m_5,&local_c8,(Option *)opt->workspace_allocator);
        if (m_2.refcount != (int *)0x0) {
          LOCK();
          *m_2.refcount = *m_2.refcount + -1;
          UNLOCK();
          if (*m_2.refcount == 0) {
            if (m_2.allocator == (Allocator *)0x0) {
              if (m_2.data != (void *)0x0) {
                free(m_2.data);
              }
            }
            else {
              (**(code **)(*(long *)m_2.allocator + 0x18))();
            }
          }
        }
        if (iVar4 != 0) goto LAB_00208914;
        if (0 < local_c8.c * (int)local_c8.cstep) {
          memset(local_c8.data,0,(ulong)(uint)(local_c8.c * (int)local_c8.cstep) << 2);
        }
        bVar7 = (this->weight_xc_data).dims == 3;
        m_2.w = (this->weight_xc_data).w;
        m_2.h = (this->weight_xc_data).h;
        m_2.c = 1;
        if (!bVar7) {
          m_2.c = (this->weight_xc_data).d;
        }
        m_2.elemsize = (this->weight_xc_data).elemsize;
        m_2.data = (void *)((this->weight_xc_data).cstep * m_2.elemsize +
                           (long)(this->weight_xc_data).data);
        m_2.dims = bVar7 ^ 3;
        m_2.elempack = (this->weight_xc_data).elempack;
        m_2.allocator = (this->weight_xc_data).allocator;
        m_2.refcount = (int *)0x0;
        m_2.cstep = (long)m_2.h * (long)m_2.w;
        m_2.d = 1;
        bVar7 = (this->bias_c_data).dims == 3;
        m_4.w = (this->bias_c_data).w;
        m_4.h = (this->bias_c_data).h;
        m_4.c = 1;
        if (!bVar7) {
          m_4.c = (this->bias_c_data).d;
        }
        m_4.dims = bVar7 ^ 3;
        m_4.elemsize = (this->bias_c_data).elemsize;
        m_4.data = (void *)((this->bias_c_data).cstep * m_4.elemsize +
                           (long)(this->bias_c_data).data);
        m_4.elempack = (this->bias_c_data).elempack;
        m_4.allocator = (this->bias_c_data).allocator;
        m_4.refcount = (int *)0x0;
        m_4.cstep = (long)m_4.h * (long)m_4.w;
        m_4.d = 1;
        bVar7 = (this->weight_hc_data).dims == 3;
        m_5.w = (this->weight_hc_data).w;
        m_5.h = (this->weight_hc_data).h;
        m_5.c = 1;
        if (!bVar7) {
          m_5.c = (this->weight_hc_data).d;
        }
        m_5.dims = bVar7 ^ 3;
        m_5.elemsize = (this->weight_hc_data).elemsize;
        m_5.data = (void *)((this->weight_hc_data).cstep * m_5.elemsize +
                           (long)(this->weight_hc_data).data);
        m_5.elempack = (this->weight_hc_data).elempack;
        m_5.allocator = (this->weight_hc_data).allocator;
        m_5.refcount = (int *)0x0;
        m_5.cstep = (long)m_5.h * (long)m_5.w;
        m_5.d = 1;
        iVar5 = rnn(bottom_blob,&m_1,1,&m_2,&m_4,&m_5,&local_c8,(Option *)opt->workspace_allocator);
        Mat::~Mat(&m_5);
        Mat::~Mat(&m_4);
        Mat::~Mat(&m_2);
        iVar4 = 0;
        if (iVar5 == 0) {
          bVar7 = true;
          if (0 < (int)_h) {
            iVar4 = 0;
            uVar6 = 0;
            do {
              __src = (void *)((long)m_1.w * uVar6 *
                               CONCAT44(m_1.elemsize._4_4_,(undefined4)m_1.elemsize) +
                              (long)m_1.data);
              __dest = (void *)((long)top_blob->w * uVar6 * top_blob->elemsize +
                               (long)top_blob->data);
              memcpy(__dest,(void *)((long)m.w * uVar6 *
                                     CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize) +
                                    (long)m.data),(long)this->num_output << 2);
              memcpy((void *)((long)this->num_output * 4 + (long)__dest),__src,
                     (long)this->num_output << 2);
              uVar6 = uVar6 + 1;
            } while (_h != uVar6);
            bVar7 = true;
          }
        }
        else {
          bVar7 = false;
          iVar4 = iVar5;
        }
      }
      piVar2 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (m_1.allocator == (Allocator *)0x0) {
            if (m_1.data != (void *)0x0) {
              free(m_1.data);
            }
          }
          else {
            (**(code **)(*(long *)m_1.allocator + 0x18))();
          }
        }
      }
    }
    piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          if (m.data != (void *)0x0) {
            free(m.data);
          }
        }
        else {
          (**(code **)(*(long *)m.allocator + 0x18))();
        }
      }
    }
    if (!bVar7) goto LAB_002088b1;
  }
  iVar4 = 0;
LAB_002088b1:
  piVar2 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        if (local_c8.data != (void *)0x0) {
          free(local_c8.data);
        }
      }
      else {
        (**(code **)(*(long *)local_c8.allocator + 0x18))();
      }
    }
  }
  return iVar4;
}

Assistant:

int RNN::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int T = bottom_blob.h;

    int num_directions = direction == 2 ? 2 : 1;

    // initial hidden state
    Mat hidden(num_output, 4u, opt.workspace_allocator);
    if (hidden.empty())
        return -100;
    hidden.fill(0.f);

    top_blob.create(num_output * num_directions, T, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Uni directional
    if (direction == 0 || direction == 1)
    {
        int ret = rnn(bottom_blob, top_blob, direction, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden, opt);
        if (ret != 0)
            return ret;
    }

    if (direction == 2)
    {
        Mat top_blob_forward(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_forward.empty())
            return -100;

        Mat top_blob_reverse(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_reverse.empty())
            return -100;

        int ret0 = rnn(bottom_blob, top_blob_forward, 0, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden, opt);
        if (ret0 != 0)
            return ret0;

        hidden.fill(0.0f);

        int ret1 = rnn(bottom_blob, top_blob_reverse, 1, weight_xc_data.channel(1), bias_c_data.channel(1), weight_hc_data.channel(1), hidden, opt);
        if (ret1 != 0)
            return ret1;

        // concat w
        for (int i = 0; i < T; i++)
        {
            const float* pf = top_blob_forward.row(i);
            const float* pr = top_blob_reverse.row(i);
            float* ptr = top_blob.row(i);

            memcpy(ptr, pf, num_output * sizeof(float));
            memcpy(ptr + num_output, pr, num_output * sizeof(float));
        }
    }

    return 0;
}